

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_math.c
# Opt level: O1

t_int * powtodb_tilde_perform(t_int *w)

{
  t_int tVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  
  tVar1 = w[3];
  if ((int)tVar1 != 0) {
    lVar2 = w[1];
    lVar3 = w[2];
    lVar4 = 0;
    do {
      fVar7 = *(float *)(lVar2 + lVar4 * 4);
      fVar5 = 0.0;
      if (0.0 < fVar7) {
        dVar6 = log((double)fVar7);
        fVar7 = (float)(dVar6 * 4.3429448190325175 + 100.0);
        fVar5 = 0.0;
        if (0.0 <= fVar7) {
          fVar5 = fVar7;
        }
      }
      *(float *)(lVar3 + lVar4 * 4) = fVar5;
      lVar4 = lVar4 + 1;
    } while ((int)tVar1 != (int)lVar4);
  }
  return w + 4;
}

Assistant:

static t_int *powtodb_tilde_perform(t_int *w)
{
    t_sample *in = (t_sample *)w[1], *out = (t_sample *)w[2];
    int n = (int)w[3];
    for (; n--; in++, out++)
    {
        t_sample f = *in;
        if (f <= 0) *out = 0;
        else
        {
            t_sample g = 100 + 10./LOGTEN * log(f);
            *out = (g < 0 ? 0 : g);
        }
    }
    return (w + 4);
}